

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintgb.h
# Opt level: O2

void __thiscall
FastPForLib::VarIntGB<false>::encodeArray
          (VarIntGB<false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  byte bVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint8_t *keyp;
  uint *puVar6;
  ulong uVar7;
  int j;
  uint uVar8;
  
  puVar5 = out + 1;
  *out = (uint32_t)length;
  for (uVar7 = 3; uVar7 < length; uVar7 = uVar7 + 4) {
    *(byte *)puVar5 = 0;
    uVar8 = in[uVar7 - 3];
    if (uVar8 < 0x100) {
      puVar4 = (uint *)((long)puVar5 + 2);
      *(byte *)((long)puVar5 + 1) = (byte)uVar8;
    }
    else if (uVar8 < 0x10000) {
      *(short *)((long)puVar5 + 1) = (short)uVar8;
      puVar4 = (uint *)((long)puVar5 + 3);
      *(byte *)puVar5 = 1;
    }
    else if (uVar8 < 0x1000000) {
      *(byte *)((long)puVar5 + 1) = (byte)uVar8;
      *(byte *)((long)puVar5 + 2) = (byte)(uVar8 >> 8);
      puVar4 = puVar5 + 1;
      *(byte *)((long)puVar5 + 3) = (byte)(uVar8 >> 0x10);
      *(byte *)puVar5 = 2;
    }
    else {
      puVar4 = (uint *)((long)puVar5 + 5);
      *(uint *)((long)puVar5 + 1) = uVar8;
      *(byte *)puVar5 = 3;
    }
    uVar8 = in[uVar7 - 2];
    if (uVar8 < 0x100) {
      *(byte *)puVar4 = (byte)uVar8;
      puVar4 = (uint *)((long)puVar4 + 1);
    }
    else if (uVar8 < 0x10000) {
      *(short *)puVar4 = (short)uVar8;
      *(byte *)puVar5 = (byte)*puVar5 | 4;
      puVar4 = (uint *)((long)puVar4 + 2);
    }
    else if (uVar8 < 0x1000000) {
      *(byte *)puVar4 = (byte)uVar8;
      *(byte *)((long)puVar4 + 1) = (byte)(uVar8 >> 8);
      *(byte *)((long)puVar4 + 2) = (byte)(uVar8 >> 0x10);
      *(byte *)puVar5 = (byte)*puVar5 | 8;
      puVar4 = (uint *)((long)puVar4 + 3);
    }
    else {
      *puVar4 = uVar8;
      *(byte *)puVar5 = (byte)*puVar5 | 0xc;
      puVar4 = puVar4 + 1;
    }
    uVar8 = in[uVar7 - 1];
    if (uVar8 < 0x100) {
      *(byte *)puVar4 = (byte)uVar8;
      puVar4 = (uint *)((long)puVar4 + 1);
    }
    else if (uVar8 < 0x10000) {
      *(short *)puVar4 = (short)uVar8;
      *(byte *)puVar5 = (byte)*puVar5 | 0x10;
      puVar4 = (uint *)((long)puVar4 + 2);
    }
    else if (uVar8 < 0x1000000) {
      *(byte *)puVar4 = (byte)uVar8;
      *(byte *)((long)puVar4 + 1) = (byte)(uVar8 >> 8);
      *(byte *)((long)puVar4 + 2) = (byte)(uVar8 >> 0x10);
      *(byte *)puVar5 = (byte)*puVar5 | 0x20;
      puVar4 = (uint *)((long)puVar4 + 3);
    }
    else {
      *puVar4 = uVar8;
      *(byte *)puVar5 = (byte)*puVar5 | 0x30;
      puVar4 = puVar4 + 1;
    }
    uVar8 = in[uVar7];
    if (uVar8 < 0x100) {
      *(byte *)puVar4 = (byte)uVar8;
      puVar5 = (uint *)((long)puVar4 + 1);
    }
    else if (uVar8 < 0x10000) {
      *(short *)puVar4 = (short)uVar8;
      *(byte *)puVar5 = (byte)*puVar5 | 0x40;
      puVar5 = (uint *)((long)puVar4 + 2);
    }
    else if (uVar8 < 0x1000000) {
      *(byte *)puVar4 = (byte)uVar8;
      *(byte *)((long)puVar4 + 1) = (byte)(uVar8 >> 8);
      *(byte *)((long)puVar4 + 2) = (byte)(uVar8 >> 0x10);
      *(byte *)puVar5 = (byte)*puVar5 | 0x80;
      puVar5 = (uint *)((long)puVar4 + 3);
    }
    else {
      *puVar4 = uVar8;
      *(byte *)puVar5 = (byte)*puVar5 | 0xc0;
      puVar5 = puVar4 + 1;
    }
  }
  uVar7 = uVar7 - 3;
  puVar4 = puVar5;
  puVar3 = puVar5;
  puVar6 = puVar5;
  if (uVar7 < length) {
    puVar4 = (uint *)((long)puVar5 + 1);
    *(byte *)puVar5 = 0;
    for (uVar8 = 0; (puVar3 = puVar4, puVar6 = puVar4, uVar7 < length && (uVar8 < 8));
        uVar8 = uVar8 + 2) {
      uVar1 = in[uVar7];
      if (uVar1 < 0x100) {
        *(byte *)puVar4 = (byte)uVar1;
        puVar4 = (uint *)((long)puVar4 + 1);
      }
      else {
        if (uVar1 < 0x10000) {
          *(short *)puVar4 = (short)uVar1;
          puVar4 = (uint *)((long)puVar4 + 2);
          bVar2 = (byte)(1 << (uVar8 & 0x1f));
        }
        else if (uVar1 < 0x1000000) {
          *(byte *)puVar4 = (byte)uVar1;
          *(byte *)((long)puVar4 + 1) = (byte)(uVar1 >> 8);
          *(byte *)((long)puVar4 + 2) = (byte)(uVar1 >> 0x10);
          puVar4 = (uint *)((long)puVar4 + 3);
          bVar2 = (byte)(2 << (uVar8 & 0x1f));
        }
        else {
          *puVar4 = uVar1;
          puVar4 = puVar4 + 1;
          bVar2 = (byte)(3 << (uVar8 & 0x1f));
        }
        *(byte *)puVar5 = (byte)*puVar5 | bVar2;
      }
      uVar7 = uVar7 + 1;
    }
  }
  for (; ((ulong)puVar4 & 3) != 0; puVar4 = (uint *)((long)puVar4 + 1)) {
    *(byte *)puVar3 = 0;
    puVar3 = (uint *)((long)puVar3 + 1);
  }
  *nvalue = (ulong)((long)puVar6 + ((ulong)(-(int)puVar6 & 3) - (long)out)) >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    uint32_t prev = 0; // for delta

    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    *out = static_cast<uint32_t>(length);
    bout += 4;

    size_t k = 0;
    for (; k + 3 < length; k += 4) {
      uint8_t *keyp = bout++;
      *keyp = 0;
      {
        const uint32_t val = delta ? in[k] - prev : in[k];
        if (delta)
          prev = in[k];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp = static_cast<uint8_t>(1);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp = static_cast<uint8_t>(2);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp = static_cast<uint8_t>(3);
        }
      }
      {
        const uint32_t val = delta ? in[k + 1] - prev : in[k + 1];
        if (delta)
          prev = in[k + 1];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 2);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 2);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 2);
        }
      }
      {
        const uint32_t val = delta ? in[k + 2] - prev : in[k + 2];
        if (delta)
          prev = in[k + 2];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 4);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 4);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 4);
        }
      }
      {
        const uint32_t val = delta ? in[k + 3] - prev : in[k + 3];
        if (delta)
          prev = in[k + 3];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 6);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 6);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 6);
        }
      }
    }

    if (k < length) {
      uint8_t *keyp = bout++;
      *keyp = 0;
      for (int j = 0; k < length && j < 8; j += 2, ++k) {
        const uint32_t val = delta ? in[k] - prev : in[k];
        if (delta)
          prev = in[k];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << j);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << j);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << j);
        }
      }
    }
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0;
    }
    const size_t storageinbytes = bout - initbout;
    assert((storageinbytes % 4) == 0);
    nvalue = storageinbytes / 4;
  }